

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

bool __thiscall GameEngine::validate(GameEngine *this)

{
  pointer psVar1;
  Map *this_00;
  int32_t iVar2;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *pvVar3;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar4;
  ostream *poVar5;
  bool bVar6;
  pointer psVar7;
  pointer __x;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> newPopulations;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> newPlayers;
  shared_ptr<Population> local_88;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> local_78;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *local_60;
  pointer local_58;
  pointer local_50;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> local_48;
  
  local_48.super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = &this->players;
  local_58 = (this->players).
             super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (this->players).
                super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != local_58; psVar7 = psVar7 + 1)
  {
    local_78.
    super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50 = psVar7;
    pvVar3 = Player::GetPlayerPopulations
                       ((psVar7->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    psVar1 = (pvVar3->
             super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__x = (pvVar3->
               super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
               )._M_impl.super__Vector_impl_data._M_start; psVar7 = local_50, __x != psVar1;
        __x = __x + 1) {
      iVar2 = Population::GetAnimalAmount
                        ((__x->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      if (iVar2 < 1) {
        this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar2 = Population::GetYPos((__x->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr);
        pvVar4 = Map::operator[](this_00,(long)iVar2);
        iVar2 = Population::GetXPos((__x->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr);
        local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        CellType::setCurrentPopulation
                  ((pvVar4->
                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[iVar2].
                   super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      else {
        std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::
        push_back(&local_78,__x);
      }
    }
    Player::SetPlayerPopulations
              ((local_50->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,&local_78);
    if (local_78.
        super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::push_back
                (&local_48,psVar7);
    }
    std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::~vector
              (&local_78);
  }
  std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::operator=
            (local_60,&local_48);
  if (((ulong)((long)(this->players).
                     super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->players).
                    super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) < 0x11) ||
     (bVar6 = true, this->maxStep < this->currentStep)) {
    poVar5 = std::operator<<((ostream *)&std::cout,"End game!");
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar6 = false;
  }
  std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::~vector
            (&local_48);
  return bVar6;
}

Assistant:

bool GameEngine::validate() {
  std::vector<std::shared_ptr<Player> > newPlayers;
  for (const auto &player : players) {
    std::vector<std::shared_ptr<Population> > newPopulations;
    for (const auto &population : player->GetPlayerPopulations()) {
      if (population->GetAnimalAmount() > 0) {
        newPopulations.push_back(population);
      } else {
        (*map)[population->GetYPos()][population->GetXPos()]->setCurrentPopulation(nullptr);
      }
    }
    player->SetPlayerPopulations(newPopulations);

    if (!newPopulations.empty()) {
      newPlayers.push_back(player);
    }
  }
  players = newPlayers;

  if ((players.size() < 2) || (currentStep > maxStep)) {
    std::cout << "End game!" << std::endl;
    return false;
  }
  return true;
}